

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

optional<tinyusdz::value::quath> * __thiscall
tinyusdz::XformOp::get_value<tinyusdz::value::quath>
          (optional<tinyusdz::value::quath> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  bool bVar1;
  optional<tinyusdz::value::quath> local_38;
  quath local_2c;
  quath value;
  TimeSampleInterpolationType interp_local;
  double t_local;
  XformOp *this_local;
  
  value.imag._M_elems._0_4_ = interp;
  unique0x100000bb = t;
  bVar1 = is_timesamples(this);
  if (bVar1) {
    bVar1 = get_interpolated_value<tinyusdz::value::quath>
                      (this,&local_2c,stack0xffffffffffffffe0,value.imag._M_elems._0_4_);
    if (bVar1) {
      nonstd::optional_lite::optional<tinyusdz::value::quath>::optional<tinyusdz::value::quath,_0>
                (__return_storage_ptr__,&local_2c);
    }
    else {
      nonstd::optional_lite::optional<tinyusdz::value::quath>::optional(__return_storage_ptr__);
    }
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::quath>(&local_38,&this->_var);
    nonstd::optional_lite::optional<tinyusdz::value::quath>::optional<tinyusdz::value::quath,_0>
              (__return_storage_ptr__,&local_38);
    nonstd::optional_lite::optional<tinyusdz::value::quath>::~optional(&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }